

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sunstepper.c
# Opt level: O3

int ARKodeCreateSUNStepper(void *arkode_mem,SUNStepper_conflict *stepper)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 200;
  }
  else {
    iVar1 = SUNStepper_Create(*arkode_mem);
    if (iVar1 == 0) {
      iVar1 = SUNStepper_SetContent(*stepper,arkode_mem);
      if (iVar1 == 0) {
        iVar1 = SUNStepper_SetEvolveFn(*stepper,arkSUNStepperEvolve);
        if (iVar1 == 0) {
          iVar1 = SUNStepper_SetOneStepFn(*stepper,arkSUNStepperOneStep);
          if (iVar1 == 0) {
            iVar1 = SUNStepper_SetFullRhsFn(*stepper,arkSUNStepperFullRhs);
            if (iVar1 == 0) {
              iVar1 = SUNStepper_SetResetFn(*stepper,arkSUNStepperReset);
              if (iVar1 == 0) {
                iVar1 = SUNStepper_SetResetCheckpointIndexFn
                                  (*stepper,arkSUNStepperResetCheckpointIndex);
                if (iVar1 == 0) {
                  iVar1 = SUNStepper_SetStopTimeFn(*stepper,arkSUNStepperSetStopTime);
                  if (iVar1 == 0) {
                    iVar1 = SUNStepper_SetStepDirectionFn(*stepper,arkSUNStepperSetStepDirection);
                    if (iVar1 != 0) {
                      return -0x33;
                    }
                    if ((*(long *)((long)arkode_mem + 0x228) == 0) ||
                       (iVar1 = SUNStepper_SetForcingFn(*stepper,arkSUNStepperSetForcing),
                       iVar1 == 0)) {
                      iVar1 = SUNStepper_SetGetNumStepsFn(*stepper,arkSUNStepperGetNumSteps);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      msgfmt = "Failed to set SUNStepper get number of steps function";
                      iVar2 = -0x33;
                      error_code = -0x33;
                      iVar1 = 0x120;
                    }
                    else {
                      msgfmt = "Failed to set SUNStepper forcing function";
                      iVar2 = -0x33;
                      error_code = -0x33;
                      iVar1 = 0x117;
                    }
                  }
                  else {
                    msgfmt = "Failed to set SUNStepper stop time function";
                    iVar2 = -0x33;
                    error_code = -0x33;
                    iVar1 = 0x10a;
                  }
                }
                else {
                  msgfmt = "Failed to set SUNStepper reset function";
                  iVar2 = -0x33;
                  error_code = -0x33;
                  iVar1 = 0x102;
                }
              }
              else {
                msgfmt = "Failed to set SUNStepper reset function";
                iVar2 = -0x33;
                error_code = -0x33;
                iVar1 = 0xf9;
              }
            }
            else {
              msgfmt = "Failed to set SUNStepper full RHS function";
              iVar2 = -0x33;
              error_code = -0x33;
              iVar1 = 0xf1;
            }
          }
          else {
            msgfmt = "Failed to set SUNStepper one step function";
            iVar2 = -0x33;
            error_code = -0x33;
            iVar1 = 0xe9;
          }
        }
        else {
          msgfmt = "Failed to set SUNStepper evolve function";
          iVar2 = -0x33;
          error_code = -0x33;
          iVar1 = 0xe1;
        }
      }
      else {
        msgfmt = "Failed to set SUNStepper content";
        iVar2 = -0x33;
        error_code = -0x33;
        iVar1 = 0xd9;
      }
    }
    else {
      msgfmt = "Failed to create SUNStepper";
      iVar2 = -0x33;
      error_code = -0x33;
      iVar1 = 0xd1;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeCreateSUNStepper",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sunstepper.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeCreateSUNStepper(void* arkode_mem, SUNStepper* stepper)
{
  /* unpack ark_mem */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  ARKodeMem ark_mem = (ARKodeMem)arkode_mem;

  SUNErrCode err = SUNStepper_Create(ark_mem->sunctx, stepper);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to create SUNStepper");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetContent(*stepper, arkode_mem);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper content");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetEvolveFn(*stepper, arkSUNStepperEvolve);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper evolve function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetOneStepFn(*stepper, arkSUNStepperOneStep);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper one step function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetFullRhsFn(*stepper, arkSUNStepperFullRhs);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper full RHS function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetResetFn(*stepper, arkSUNStepperReset);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper reset function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetResetCheckpointIndexFn(*stepper,
                                             arkSUNStepperResetCheckpointIndex);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper reset function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetStopTimeFn(*stepper, arkSUNStepperSetStopTime);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper stop time function");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_SetStepDirectionFn(*stepper, arkSUNStepperSetStepDirection);
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  if (ark_mem->step_setforcing != NULL)
  {
    err = SUNStepper_SetForcingFn(*stepper, arkSUNStepperSetForcing);
    if (err != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                      "Failed to set SUNStepper forcing function");
      return ARK_SUNSTEPPER_ERR;
    }
  }

  err = SUNStepper_SetGetNumStepsFn(*stepper, arkSUNStepperGetNumSteps);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Failed to set SUNStepper get number of steps function");
    return ARK_SUNSTEPPER_ERR;
  }

  return ARK_SUCCESS;
}